

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder * capnp::_::WireHelpers::getWritableTextPointer
                    (Builder *__return_storage_ptr__,WirePointer *ref,word *refTarget,
                    SegmentBuilder *segment,CapTableBuilder *capTable,void *defaultValue,
                    TextSize defaultSize)

{
  undefined8 value;
  bool bVar1;
  ElementCountN<29> a;
  uint uVar2;
  uchar *to;
  uint *puVar3;
  Builder *builder;
  Fault local_150;
  Fault f_3;
  Fault local_140;
  Fault f_2;
  uchar *local_130;
  undefined1 local_128 [8];
  DebugComparison<unsigned_char_&,_char> _kjCondition_2;
  uint *size;
  uint *_size1692;
  Maybe<unsigned_int> maybeSize;
  Fault f_1;
  undefined1 local_d8 [8];
  DebugComparison<capnp::ElementSize,_capnp::ElementSize> _kjCondition_1;
  Fault local_a8;
  Fault f;
  Kind local_98;
  DebugExpression<capnp::_::WirePointer::Kind> local_94;
  undefined1 local_90 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  byte *bptr;
  word *ptr;
  SegmentAnd<capnp::Text::Builder> local_50;
  byte *local_30;
  void *defaultValue_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  word *refTarget_local;
  WirePointer *ref_local;
  
  local_30 = (byte *)defaultValue;
  defaultValue_local = capTable;
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)refTarget;
  refTarget_local = (word *)ref;
  bVar1 = WirePointer::isNull(ref);
  if (!bVar1) {
    _kjCondition._24_8_ =
         followFars((WirePointer **)&refTarget_local,(word *)segment_local,
                    (SegmentBuilder **)&capTable_local);
    local_98 = WirePointer::kind((WirePointer *)refTarget_local);
    local_94 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_98);
    f.exception._4_4_ = 1;
    kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
              ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_90
               ,&local_94,(Kind *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_90);
    if (bVar1) {
      f_1.exception._6_1_ =
           WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
      f_1.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (ElementSize *)((long)&f_1.exception + 6));
      f_1.exception._5_1_ = 2;
      kj::_::DebugExpression<capnp::ElementSize>::operator==
                ((DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)local_d8,
                 (DebugExpression<capnp::ElementSize> *)((long)&f_1.exception + 7),
                 (ElementSize *)((long)&f_1.exception + 5));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d8);
      if (bVar1) {
        a = WirePointer::ListRef::elementCount((ListRef *)((long)&refTarget_local->content + 4));
        trySubtract<unsigned_int,unsigned_int>((capnp *)&_size1692,a,1);
        puVar3 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&_size1692);
        if (puVar3 == (uint *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&local_150,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x6a3,FAILED,(char *)0x0,
                     "\"zero-size blob can\'t be text (need NUL terminator)\"",
                     (char (*) [51])"zero-size blob can\'t be text (need NUL terminator)");
          f_3.exception._4_4_ = 2;
          kj::_::Debug::Fault::~Fault(&local_150);
        }
        else {
          _kjCondition_2._32_8_ = puVar3;
          local_130 = (uchar *)kj::_::DebugExpressionStart::operator<<
                                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                          (uchar *)(_kjCondition._24_8_ + (ulong)*puVar3));
          f_2.exception._7_1_ = 0;
          kj::_::DebugExpression<unsigned_char&>::operator==
                    ((DebugComparison<unsigned_char_&,_char> *)local_128,
                     (DebugExpression<unsigned_char&> *)&local_130,
                     (char *)((long)&f_2.exception + 7));
          bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
          value = _kjCondition._24_8_;
          if (bVar1) {
            uVar2 = unbound<unsigned_int>(*(uint *)_kjCondition_2._32_8_);
            Text::Builder::Builder(__return_storage_ptr__,(char *)value,(ulong)uVar2);
            f_3.exception._4_4_ = 1;
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char&,char>&,char_const(&)[34]>
                      (&local_140,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x69d,FAILED,"*(bptr + size) == \'\\0\'",
                       "_kjCondition,\"Text blob missing NUL terminator.\"",
                       (DebugComparison<unsigned_char_&,_char> *)local_128,
                       (char (*) [34])"Text blob missing NUL terminator.");
            f_3.exception._4_4_ = 2;
            kj::_::Debug::Fault::~Fault(&local_140);
          }
        }
        kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&_size1692);
        if (f_3.exception._4_4_ == 1) {
          return __return_storage_ptr__;
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[94]>
                  ((Fault *)&maybeSize,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x696,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "_kjCondition,\"Schema mismatch: Called getText{Field,Element}() but existing list pointer is not \" \"byte-sized.\""
                   ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)local_d8,
                   (char (*) [94])
                   "Schema mismatch: Called getText{Field,Element}() but existing list pointer is not byte-sized."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)&maybeSize);
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[85]>
                (&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x691,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  local_90,
                 (char (*) [85])
                 "Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&local_a8);
    }
  }
  if (defaultSize == 0) {
    Text::Builder::Builder(__return_storage_ptr__,(void *)0x0);
  }
  else {
    initTextPointer(&local_50,(WirePointer *)refTarget_local,(SegmentBuilder *)capTable_local,
                    (CapTableBuilder *)defaultValue_local,defaultSize,(BuilderArena *)0x0);
    *(undefined8 *)__return_storage_ptr__ = local_50.value._0_8_;
    (__return_storage_ptr__->content).ptr = local_50.value.content.ptr;
    (__return_storage_ptr__->content).size_ = local_50.value.content.size_;
    _ptr = Text::Builder::asBytes(__return_storage_ptr__);
    to = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&ptr);
    copyMemory(to,local_30,defaultSize);
  }
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(Text::Builder getWritableTextPointer(
      WirePointer* ref, word* refTarget, SegmentBuilder* segment, CapTableBuilder* capTable,
      const void* defaultValue, TextSize defaultSize)) {
    if (ref->isNull()) {
    useDefault:
      if (defaultSize == ZERO * BYTES) {
        return nullptr;
      } else {
        Text::Builder builder = initTextPointer(ref, segment, capTable, defaultSize).value;
        copyMemory(builder.asBytes().begin(), reinterpret_cast<const byte*>(defaultValue),
                   defaultSize);
        return builder;
      }
    } else {
      word* ptr = followFars(ref, refTarget, segment);
      byte* bptr = reinterpret_cast<byte*>(ptr);

      KJ_REQUIRE(ref->kind() == WirePointer::LIST,
          "Schema mismatch: Called getText{Field,Element}() but existing pointer is not a list.") {
        goto useDefault;
      }
      KJ_REQUIRE(ref->listRef.elementSize() == ElementSize::BYTE,
          "Schema mismatch: Called getText{Field,Element}() but existing list pointer is not "
          "byte-sized.") {
        goto useDefault;
      }

      auto maybeSize = trySubtract(ref->listRef.elementCount() * (ONE * BYTES / ELEMENTS),
                                   ONE * BYTES);
      KJ_IF_SOME(size, maybeSize) {
        KJ_REQUIRE(*(bptr + size) == '\0', "Text blob missing NUL terminator.") {
          goto useDefault;
        }

        return Text::Builder(reinterpret_cast<char*>(bptr), unbound(size / BYTES));
      } else {
        KJ_FAIL_REQUIRE("zero-size blob can't be text (need NUL terminator)") {
          goto useDefault;
        };
      }